

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

QPair<int,_QPair<bool,_bool>_> scanDelims(QString *text,int start,bool canSplitWord)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  char16_t cVar11;
  int iVar12;
  ulong uVar13;
  QPair<int,_QPair<bool,_bool>_> QVar14;
  char16_t cVar15;
  byte local_3a;
  
  pcVar2 = (text->d).ptr;
  uVar13 = (text->d).size;
  lVar9 = (long)start;
  if (start < 1) {
    cVar15 = L'\0';
  }
  else {
    cVar15 = pcVar2[(ulong)(uint)start - 1];
  }
  pcVar1 = pcVar2 + lVar9;
  iVar10 = (int)uVar13;
  uVar13 = uVar13 & 0xffffffff;
  if (iVar10 < start) {
    uVar13 = (ulong)(uint)start;
  }
  do {
    iVar12 = (int)uVar13;
    if (iVar10 <= lVar9) {
LAB_00122a2e:
      cVar11 = L'\0';
      if (iVar12 + 1 < iVar10) {
        cVar11 = pcVar2[iVar12];
      }
      iVar10 = (int)(char)cVar15;
      if (0xff < (ushort)cVar15) {
        iVar10 = 0;
      }
      bVar3 = isMDAsciiPunct(iVar10);
      local_3a = 1;
      bVar4 = 1;
      if (!bVar3) {
        bVar4 = QChar::isPunct((uint)(ushort)cVar15);
      }
      iVar10 = (int)(char)cVar11;
      if (0xff < (ushort)cVar11) {
        iVar10 = 0;
      }
      bVar3 = isMDAsciiPunct(iVar10);
      if (!bVar3) {
        local_3a = QChar::isPunct((uint)(ushort)cVar11);
      }
      bVar3 = true;
      if (cVar15 != L'\0') {
        bVar3 = QChar::isSpace((uint)(ushort)cVar15);
      }
      if ((cVar11 == L'\0') || (bVar5 = QChar::isSpace((uint)(ushort)cVar11), bVar5)) {
        bVar6 = 0;
        bVar5 = true;
      }
      else {
        bVar6 = bVar4 | bVar3 | local_3a ^ 1;
        bVar5 = false;
      }
      bVar8 = bVar3 ^ 1;
      bVar7 = local_3a;
      if (bVar4 == 0) {
        bVar7 = bVar8;
      }
      if (bVar5) {
        bVar7 = bVar8;
      }
      if (bVar3 != false) {
        bVar7 = bVar8;
      }
      bVar8 = bVar6 ^ 1 | local_3a;
      bVar4 = ~bVar7 | bVar4;
      if (canSplitWord) {
        bVar8 = bVar7 & canSplitWord;
        bVar4 = bVar6 & canSplitWord;
      }
      if (bVar6 == 0) {
        bVar4 = bVar6 & canSplitWord;
      }
      QVar14.first = iVar12 - start;
      if (bVar7 == 0) {
        bVar8 = bVar7 & canSplitWord;
      }
      QVar14._4_4_ = bVar4 & 1 | (uint)bVar8 << 8;
      return QVar14;
    }
    if (pcVar2[lVar9] != *pcVar1) {
      iVar12 = (int)lVar9;
      goto LAB_00122a2e;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

QPair<int, QPair<bool, bool>> scanDelims(const QString &text, const int start,
                                         const bool canSplitWord) {
    int pos = start;
    const int textLen = text.length();
    const QChar marker = text.at(start);
    bool leftFlanking = true;
    bool rightFlanking = true;

    const QChar lastChar = start > 0 ? text.at(start - 1) : QChar('\0');

    while (pos < textLen && text.at(pos) == marker) ++pos;
    const int length = pos - start;

    const QChar nextChar = pos + 1 < textLen ? text.at(pos) : QChar('\0');

    const bool isLastPunct =
        isMDAsciiPunct(lastChar.toLatin1()) || lastChar.isPunct();
    const bool isNextPunct =
        isMDAsciiPunct(nextChar.toLatin1()) || nextChar.isPunct();
    // treat line end and start as whitespace
    const bool isLastWhiteSpace = lastChar.isNull() ? true : lastChar.isSpace();
    const bool isNextWhiteSpace = nextChar.isNull() ? true : nextChar.isSpace();

    if (isNextWhiteSpace) {
        leftFlanking = false;
    } else if (isNextPunct) {
        if (!(isLastWhiteSpace || isLastPunct)) leftFlanking = false;
    }

    if (isLastWhiteSpace) {
        rightFlanking = false;
    } else if (isLastPunct) {
        if (!(isNextWhiteSpace || isNextPunct)) rightFlanking = false;
    }

    //    qDebug () << isNextWhiteSpace << marker;
    //    qDebug () << text << leftFlanking << rightFlanking << lastChar <<
    //    nextChar;

    const bool canOpen = canSplitWord
                             ? leftFlanking
                             : leftFlanking && (!rightFlanking || isLastPunct);
    const bool canClose = canSplitWord
                              ? rightFlanking
                              : rightFlanking && (!leftFlanking || isNextPunct);

    return QPair<int, QPair<bool, bool>>{length, {canOpen, canClose}};
}